

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

bool __thiscall QTest::WatchDog::waitFor(WatchDog *this,unique_lock<std::mutex> *m,Expectation e)

{
  long lVar1;
  anon_class_16_2_fd512dd2 __p;
  anon_class_16_2_fd512dd2 __p_00;
  condition_variable *this_00;
  Expectation in_RDX;
  duration<long,_std::ratio<1L,_1000L>_> *in_RSI;
  WatchDog *in_RDI;
  long in_FS_OFFSET;
  anon_class_16_2_fd512dd2 expectationChanged;
  unique_lock<std::mutex> *in_stack_ffffffffffffff80;
  condition_variable *in_stack_ffffffffffffff88;
  WatchDog *__lock;
  byte local_41;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __lock = in_RDI;
  this_00 = (condition_variable *)state(in_RDX);
  if ((condition_variable *)0x1 < this_00) {
    if (this_00 == (condition_variable *)0x2) {
      defaultTimeout();
      __p_00.e = in_RDX;
      __p_00.this = in_RDI;
      local_41 = std::condition_variable::
                 wait_for<long,std::ratio<1l,1000l>,QTest::WatchDog::waitFor(std::unique_lock<std::mutex>&,QTest::WatchDog::Expectation)::_lambda()_1_>
                           (this_00,(unique_lock<std::mutex> *)__lock,in_RSI,__p_00);
      goto LAB_00160c8f;
    }
    if (this_00 != (condition_variable *)0x3) goto LAB_00160c8f;
  }
  __p.e = (Expectation)this_00;
  __p.this = __lock;
  std::condition_variable::
  wait<QTest::WatchDog::waitFor(std::unique_lock<std::mutex>&,QTest::WatchDog::Expectation)::_lambda()_1_>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,__p);
  local_41 = 1;
LAB_00160c8f:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_41 & 1);
}

Assistant:

bool waitFor(std::unique_lock<std::mutex> &m, Expectation e)
    {
        auto expectationChanged = [this, e] { return expecting.load(std::memory_order_relaxed) != e; };
        switch (state(e)) {
        case TestFunctionEnd:
            return waitCondition.wait_for(m, defaultTimeout(), expectationChanged);
        case ThreadStart:
        case ThreadEnd:
        case TestFunctionStart:
            waitCondition.wait(m, expectationChanged);
            return true;
        }
        Q_UNREACHABLE_RETURN(false);
    }